

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_core.hpp
# Opt level: O3

bool __thiscall iutest::UnitTest::Failed(UnitTest *this)

{
  pointer ppTVar1;
  pointer ppTVar2;
  bool bVar3;
  bool bVar4;
  pointer ppTVar5;
  
  bVar3 = TestResult::Failed(&(this->super_UnitTestImpl).m_ad_hoc_testresult);
  bVar4 = true;
  if (!bVar3) {
    ppTVar1 = (this->super_UnitTestImpl).m_testsuites.
              super__Vector_base<iutest::TestSuite_*,_std::allocator<iutest::TestSuite_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    ppTVar2 = (this->super_UnitTestImpl).m_testsuites.
              super__Vector_base<iutest::TestSuite_*,_std::allocator<iutest::TestSuite_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if (ppTVar1 == ppTVar2) {
      bVar4 = false;
    }
    else {
      do {
        ppTVar5 = ppTVar1 + 1;
        bVar4 = TestSuite::Passed(*ppTVar1);
        if (!bVar4) break;
        ppTVar1 = ppTVar5;
      } while (ppTVar5 != ppTVar2);
      bVar4 = !bVar4;
    }
  }
  return bVar4;
}

Assistant:

bool            Failed()            const { return !Passed(); }